

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegularExpression.cxx
# Opt level: O0

bool __thiscall cmsys::RegularExpression::deep_equal(RegularExpression *this,RegularExpression *rxp)

{
  size_type sVar1;
  size_type sVar2;
  int iVar3;
  bool local_31;
  int local_24;
  int ind;
  RegularExpression *rxp_local;
  RegularExpression *this_local;
  
  local_24 = this->progsize;
  if (this->progsize == rxp->progsize) {
    do {
      iVar3 = local_24 + -1;
      if (local_24 == 0) {
        sVar1 = RegularExpressionMatch::start(&this->regmatch);
        sVar2 = RegularExpressionMatch::start(&rxp->regmatch);
        local_31 = false;
        if (sVar1 == sVar2) {
          sVar1 = RegularExpressionMatch::end(&this->regmatch);
          sVar2 = RegularExpressionMatch::end(&rxp->regmatch);
          local_31 = sVar1 == sVar2;
        }
        return local_31;
      }
      local_24 = iVar3;
    } while (this->program[iVar3] == rxp->program[iVar3]);
  }
  return false;
}

Assistant:

bool RegularExpression::deep_equal(const RegularExpression& rxp) const
{
  int ind = this->progsize;                     // Get regular expression size
  if (ind != rxp.progsize)                      // If different size regexp
    return false;                               // Return failure
  while (ind-- != 0)                            // Else while still characters
    if (this->program[ind] != rxp.program[ind]) // If regexp are different
      return false;                             // Return failure
  // Else if same start/end ptrs, return true
  return (this->regmatch.start() == rxp.regmatch.start() &&
          this->regmatch.end() == rxp.regmatch.end());
}